

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm_test.cpp
# Opt level: O2

pint p_test_case_pshm_invalid_test(void)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar2 = p_shm_new(0,0,1,0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x6c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_shm_lock(0,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x6d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_shm_unlock(0,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x6e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_shm_get_address(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x6f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_shm_get_size(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x70);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_shm_take_ownership(0);
  uVar3 = p_shm_new("p_shm_invalid_test",0,1,0);
  p_shm_take_ownership(uVar3);
  p_shm_free(uVar3);
  uVar3 = p_shm_new("p_shm_invalid_test",10,0xffffffffffffffff,0);
  p_shm_take_ownership(uVar3);
  p_shm_free(uVar3);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (pshm_invalid_test)
{
	p_libsys_init ();

	P_TEST_CHECK (p_shm_new (NULL, 0, P_SHM_ACCESS_READWRITE, NULL) == NULL);
	P_TEST_CHECK (p_shm_lock (NULL, NULL) == FALSE);
	P_TEST_CHECK (p_shm_unlock (NULL, NULL) == FALSE);
	P_TEST_CHECK (p_shm_get_address (NULL) == NULL);
	P_TEST_CHECK (p_shm_get_size (NULL) == 0);
	p_shm_take_ownership (NULL);

	PShm *shm = p_shm_new ("p_shm_invalid_test", 0, P_SHM_ACCESS_READWRITE, NULL);
	p_shm_take_ownership (shm);
	p_shm_free (shm);

	shm = p_shm_new ("p_shm_invalid_test", 10, (PShmAccessPerms) -1, NULL);
	p_shm_take_ownership (shm);
	p_shm_free (shm);

	p_libsys_shutdown ();
}